

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O0

int __thiscall
FIX::DataDictionary::addXMLComponentFields
          (DataDictionary *this,DOMDocument *pDoc,DOMNode *pNode,string *msgtype,DataDictionary *DD,
          bool componentRequired)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer pDVar4;
  pointer pDVar5;
  ConfigError *pCVar6;
  bool local_3fa;
  bool local_3d2;
  byte local_3ba;
  bool local_372;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_328;
  bool local_31a;
  allocator<char> local_319;
  string local_318 [6];
  bool isRequired_1;
  undefined1 local_2f8 [8];
  string required_2;
  DOMAttributesPtr attrs_3;
  allocator<char> local_2a9;
  string local_2a8 [6];
  bool isRequired;
  undefined1 local_288 [8];
  string required_1;
  DOMAttributesPtr attrs_2;
  allocator<char> local_239;
  string local_238 [32];
  undefined1 local_218 [8];
  string required;
  int field;
  allocator<char> local_1c9;
  string local_1c8 [32];
  undefined1 local_1a8 [8];
  string name_1;
  DOMAttributesPtr attrs_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_138;
  DOMNodePtr pComponentFieldNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_c8;
  DOMNodePtr pComponentNode;
  string local_b8;
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  string name;
  DOMAttributesPtr attrs;
  int firstField;
  bool componentRequired_local;
  DataDictionary *DD_local;
  string *msgtype_local;
  DOMNode *pNode_local;
  DOMDocument *pDoc_local;
  DataDictionary *this_local;
  
  attrs._M_t.super___uniq_ptr_impl<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>.
  _M_t.super__Tuple_impl<0UL,_FIX::DOMAttributes_*,_std::default_delete<FIX::DOMAttributes>_>.
  super__Head_base<0UL,_FIX::DOMAttributes_*,_false>._M_head_impl._0_4_ = 0;
  (*pNode->_vptr_DOMNode[4])();
  std::__cxx11::string::string((string *)local_60);
  pDVar4 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::operator->
                     ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                      ((long)&name.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"name",&local_81);
  iVar2 = (*pDVar4->_vptr_DOMAttributes[2])(pDVar4,local_80,local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  if ((((byte)iVar2 ^ 0xff) & 1) != 0) {
    pComponentNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t
    .super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
    super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._6_1_ = 1;
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"No name given to component",
               (allocator<char> *)
               ((long)&pComponentNode._M_t.
                       super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t.
                       super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
                       super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl + 7));
    ConfigError::ConfigError(pCVar6,&local_b8);
    pComponentNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>._M_t
    .super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
    super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._6_1_ = 0;
    __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  std::operator+(&local_108,"/fix/components/component[@name=\'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::operator+(&local_e8,&local_108,"\']");
  (*pDoc->_vptr_DOMDocument[5])(&local_c8,pDoc,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_c8);
  if (pDVar5 == (pointer)0x0) {
    pComponentFieldNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>
    ._M_t.super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
    super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._7_1_ = 1;
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_128,"Component not found: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    ConfigError::ConfigError(pCVar6,&local_128);
    pComponentFieldNode._M_t.super___uniq_ptr_impl<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>
    ._M_t.super__Tuple_impl<0UL,_FIX::DOMNode_*,_std::default_delete<FIX::DOMNode>_>.
    super__Head_base<0UL,_FIX::DOMNode_*,_false>._M_head_impl._7_1_ = 0;
    __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->(&local_c8);
  (*pDVar5->_vptr_DOMNode[2])(&local_138);
  do {
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_138);
    if (pDVar5 == (pointer)0x0) {
      std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_138);
      std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_c8);
      std::__cxx11::string::~string((string *)local_60);
      std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                 ((long)&name.field_2 + 8));
      return (int)attrs._M_t.
                  super___uniq_ptr_impl<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_FIX::DOMAttributes_*,_std::default_delete<FIX::DOMAttributes>_>
                  .super__Head_base<0UL,_FIX::DOMAttributes_*,_false>._M_head_impl;
    }
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                       (&local_138);
    (*pDVar5->_vptr_DOMNode[5])(&local_158);
    bVar1 = std::operator==(&local_158,"field");
    local_372 = true;
    if (!bVar1) {
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_138);
      (*pDVar5->_vptr_DOMNode[5])(&local_178);
      local_372 = std::operator==(&local_178,"group");
      std::__cxx11::string::~string((string *)&local_178);
    }
    std::__cxx11::string::~string((string *)&local_158);
    if (local_372 != false) {
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_138);
      (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&name_1.field_2 + 8));
      std::__cxx11::string::string((string *)local_1a8);
      pDVar4 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
               operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                           *)((long)&name_1.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1c8,"name",&local_1c9);
      iVar2 = (*pDVar4->_vptr_DOMAttributes[2])(pDVar4,local_1c8,local_1a8);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      if ((((byte)iVar2 ^ 0xff) & 1) != 0) {
        required.field_2._M_local_buf[0xe] = '\x01';
        pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&field,"No name given to field",
                   (allocator<char> *)(required.field_2._M_local_buf + 0xf));
        ConfigError::ConfigError(pCVar6,(string *)&field);
        required.field_2._M_local_buf[0xe] = '\0';
        __cxa_throw(pCVar6,&ConfigError::typeinfo,ConfigError::~ConfigError);
      }
      required.field_2._8_4_ = lookupXMLFieldNumber(this,pDoc,(string *)local_1a8);
      if ((int)attrs._M_t.
               super___uniq_ptr_impl<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>.
               _M_t.
               super__Tuple_impl<0UL,_FIX::DOMAttributes_*,_std::default_delete<FIX::DOMAttributes>_>
               .super__Head_base<0UL,_FIX::DOMAttributes_*,_false>._M_head_impl == 0) {
        attrs._M_t.
        super___uniq_ptr_impl<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>._M_t.
        super__Tuple_impl<0UL,_FIX::DOMAttributes_*,_std::default_delete<FIX::DOMAttributes>_>.
        super__Head_base<0UL,_FIX::DOMAttributes_*,_false>._M_head_impl._0_4_ =
             required.field_2._8_4_;
      }
      std::__cxx11::string::string((string *)local_218);
      pDVar4 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
               operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                           *)((long)&name_1.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_238,"required",&local_239);
      uVar3 = (*pDVar4->_vptr_DOMAttributes[2])(pDVar4,local_238,local_218);
      local_3ba = 0;
      if ((uVar3 & 1) != 0) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_218,"Y");
        if (!bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_218,"y");
          local_3ba = 0;
          if (!bVar1) goto LAB_0020d9b3;
        }
        local_3ba = componentRequired;
      }
LAB_0020d9b3:
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator(&local_239);
      if ((local_3ba & 1) != 0) {
        addRequiredField(this,msgtype,required.field_2._8_4_);
      }
      addField(DD,required.field_2._8_4_);
      addMsgField(DD,msgtype,required.field_2._8_4_);
      std::__cxx11::string::~string((string *)local_218);
      std::__cxx11::string::~string((string *)local_1a8);
      std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                 ((long)&name_1.field_2 + 8));
    }
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                       (&local_138);
    (*pDVar5->_vptr_DOMNode[5])(&attrs_2);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &attrs_2,"component");
    std::__cxx11::string::~string((string *)&attrs_2);
    if (bVar1) {
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_138);
      (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&required_1.field_2 + 8));
      std::__cxx11::string::string((string *)local_288);
      pDVar4 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
               operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                           *)((long)&required_1.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2a8,"required",&local_2a9);
      (*pDVar4->_vptr_DOMAttributes[2])(pDVar4,local_2a8,local_288);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_288,"Y");
      local_3d2 = true;
      if (!bVar1) {
        local_3d2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_288,"y");
      }
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_138);
      addXMLComponentFields(this,pDoc,pDVar5,msgtype,DD,local_3d2);
      std::__cxx11::string::~string((string *)local_288);
      std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                 ((long)&required_1.field_2 + 8));
    }
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                       (&local_138);
    (*pDVar5->_vptr_DOMNode[5])(&attrs_3);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &attrs_3,"group");
    std::__cxx11::string::~string((string *)&attrs_3);
    if (bVar1) {
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_138);
      (*pDVar5->_vptr_DOMNode[4])((undefined1 *)((long)&required_2.field_2 + 8));
      std::__cxx11::string::string((string *)local_2f8);
      pDVar4 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
               operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                           *)((long)&required_2.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_318,"required",&local_319);
      (*pDVar4->_vptr_DOMAttributes[2])(pDVar4,local_318,local_2f8);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator(&local_319);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2f8,"Y");
      local_3fa = true;
      if (!bVar1) {
        local_3fa = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_2f8,"y");
      }
      local_31a = local_3fa;
      pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_138);
      addXMLGroup(this,pDoc,pDVar5,msgtype,DD,(bool)(local_31a & 1));
      std::__cxx11::string::~string((string *)local_2f8);
      std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                 ((long)&required_2.field_2 + 8));
    }
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                       (&local_138);
    (*pDVar5->_vptr_DOMNode[3])(&local_328);
    pDVar5 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::release(&local_328);
    std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::reset(&local_138,pDVar5);
    std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_328);
  } while( true );
}

Assistant:

int DataDictionary::addXMLComponentFields(
    DOMDocument *pDoc,
    DOMNode *pNode,
    const std::string &msgtype,
    DataDictionary &DD,
    bool componentRequired) {
  int firstField = 0;

  DOMAttributesPtr attrs = pNode->getAttributes();
  std::string name;
  if (!attrs->get("name", name)) {
    throw ConfigError("No name given to component");
  }

  DOMNodePtr pComponentNode = pDoc->getNode("/fix/components/component[@name='" + name + "']");
  if (pComponentNode.get() == 0) {
    throw ConfigError("Component not found: " + name);
  }

  DOMNodePtr pComponentFieldNode = pComponentNode->getFirstChildNode();
  while (pComponentFieldNode.get()) {
    if (pComponentFieldNode->getName() == "field" || pComponentFieldNode->getName() == "group") {
      DOMAttributesPtr attrs = pComponentFieldNode->getAttributes();
      std::string name;
      if (!attrs->get("name", name)) {
        throw ConfigError("No name given to field");
      }
      int field = lookupXMLFieldNumber(pDoc, name);
      if (firstField == 0) {
        firstField = field;
      }

      std::string required;
      if (attrs->get("required", required) && (required == "Y" || required == "y") && componentRequired) {
        addRequiredField(msgtype, field);
      }

      DD.addField(field);
      DD.addMsgField(msgtype, field);
    }
    if (pComponentFieldNode->getName() == "component") {
      DOMAttributesPtr attrs = pComponentFieldNode->getAttributes();
      std::string required;
      attrs->get("required", required);
      bool isRequired = (required == "Y" || required == "y");
      addXMLComponentFields(pDoc, pComponentFieldNode.get(), msgtype, DD, isRequired);
    }
    if (pComponentFieldNode->getName() == "group") {
      DOMAttributesPtr attrs = pComponentFieldNode->getAttributes();
      std::string required;
      attrs->get("required", required);
      bool isRequired = (required == "Y" || required == "y");
      addXMLGroup(pDoc, pComponentFieldNode.get(), msgtype, DD, isRequired);
    }
    RESET_AUTO_PTR(pComponentFieldNode, pComponentFieldNode->getNextSiblingNode());
  }
  return firstField;
}